

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zm.c
# Opt level: O1

void zmSqrMont2(word *b,word *a,qr_o *r,void *stack)

{
  void *pvVar1;
  void *stack_00;
  ulong uVar2;
  
  pvVar1 = r->params;
  stack_00 = (void *)(r->n * 0x10 + (long)stack);
  zzSqr((word *)stack,a,r->n,stack_00);
  zzRedMont((word *)stack,r->mod,r->n,*r->params,stack_00);
  wwCopy(b,(word *)stack,r->n);
  for (uVar2 = *(ulong *)((long)pvVar1 + 8); uVar2 < r->n << 6; uVar2 = uVar2 + 1) {
    zzDoubleMod(b,b,r->mod,r->n);
  }
  return;
}

Assistant:

static void zmSqrMont2(word b[], const word a[], const qr_o* r, void* stack)
{
	register size_t k;
	const zm_mont_params_st* params;
	word* prod = (word*)stack;
	// pre
	ASSERT(zmIsOperable(r));
	ASSERT(zmIsIn(a, r));
	// настроить указатели
	params = (const zm_mont_params_st*)r->params;
	stack = prod + 2 * r->n;
	// b <- a^2 B^{-n} \mod mod
	zzSqr(prod, a, r->n, stack);
	zzRedMont(prod, r->mod, r->n, *(word*)r->params, stack);
	wwCopy(b, prod, r->n);
	// b <- b * B^n / 2^l \mod mod
	for (k = params->l; k < B_PER_W * r->n; ++k)
		zzDoubleMod(b, b, r->mod, r->n);
}